

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

Value * __thiscall Json::Path::resolve(Path *this,Value *root)

{
  bool bVar1;
  reference key;
  Value *pVVar2;
  Value *pVVar3;
  PathArgument *arg;
  __normal_iterator<const_Json::PathArgument_*,_std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>_>
  local_30;
  const_iterator it;
  Value *node;
  Value *root_local;
  Path *this_local;
  
  it._M_current = (PathArgument *)root;
  local_30._M_current =
       (PathArgument *)
       std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>::begin(&this->args_);
  do {
    arg = (PathArgument *)
          std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>::end(&this->args_);
    bVar1 = __gnu_cxx::operator!=
                      (&local_30,
                       (__normal_iterator<const_Json::PathArgument_*,_std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>_>
                        *)&arg);
    if (!bVar1) {
      return (Value *)it._M_current;
    }
    key = __gnu_cxx::
          __normal_iterator<const_Json::PathArgument_*,_std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>_>
          ::operator*(&local_30);
    if (key->kind_ == kindIndex) {
      bVar1 = Value::isArray((Value *)it._M_current);
      if ((!bVar1) || (bVar1 = Value::isValidIndex((Value *)it._M_current,key->index_), !bVar1)) {
        return Value::null;
      }
      it._M_current = (PathArgument *)Value::operator[](it._M_current,key->index_);
    }
    else if (key->kind_ == kindKey) {
      bVar1 = Value::isObject((Value *)it._M_current);
      if (!bVar1) {
        return Value::null;
      }
      pVVar2 = Value::operator[]((Value *)it._M_current,&key->key_);
      it._M_current = (PathArgument *)pVVar2;
      pVVar3 = Value::nullSingleton();
      if (pVVar2 == pVVar3) {
        return Value::null;
      }
    }
    __gnu_cxx::
    __normal_iterator<const_Json::PathArgument_*,_std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>_>
    ::operator++(&local_30);
  } while( true );
}

Assistant:

const Value& Path::resolve(const Value& root) const {
  const Value* node = &root;
  for (Args::const_iterator it = args_.begin(); it != args_.end(); ++it) {
    const PathArgument& arg = *it;
    if (arg.kind_ == PathArgument::kindIndex) {
      if (!node->isArray() || !node->isValidIndex(arg.index_)) {
        // Error: unable to resolve path (array value expected at position...
        return Value::null;
      }
      node = &((*node)[arg.index_]);
    } else if (arg.kind_ == PathArgument::kindKey) {
      if (!node->isObject()) {
        // Error: unable to resolve path (object value expected at position...)
        return Value::null;
      }
      node = &((*node)[arg.key_]);
      if (node == &Value::nullSingleton()) {
        // Error: unable to resolve path (object has no member named '' at
        // position...)
        return Value::null;
      }
    }
  }
  return *node;
}